

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_ccb0f7::ResizeRealtimeTest_TestInternalResizeDownUpChangeBitRateScreen_Test::
TestBody(ResizeRealtimeTest_TestInternalResizeDownUpChangeBitRateScreen_Test *this)

{
  bool bVar1;
  char *message;
  ResizeRealtimeTest *in_RDI;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  FrameInfo *info;
  iterator __end1;
  iterator __begin1;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *__range1;
  int resize_down_count;
  uint frame_number;
  uint last_h;
  uint last_w;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  I420VideoSource video;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffe1c;
  undefined4 uVar3;
  undefined4 in_stack_fffffffffffffe24;
  uint *in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  int iVar4;
  Message *in_stack_fffffffffffffe40;
  string *in_stack_fffffffffffffe48;
  Type TVar5;
  HasNewFatalFailureHelper *in_stack_fffffffffffffe50;
  allocator *paVar6;
  AssertionResult local_178;
  Message *in_stack_fffffffffffffe98;
  AssertHelper *in_stack_fffffffffffffea0;
  AssertionResult local_150 [2];
  AssertionResult local_130 [2];
  AssertionResult local_110;
  reference local_100;
  FrameInfo *local_f8;
  __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
  local_f0;
  vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
  *local_e8;
  int local_e0;
  uint local_dc;
  uint local_d8;
  uint local_d4;
  uint local_bc;
  HasNewFatalFailureHelper local_b8;
  allocator local_89;
  string local_88 [32];
  undefined1 local_68 [104];
  
  paVar6 = &local_89;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_88,"hantro_collage_w352h288.yuv",paVar6);
  uVar3 = 300;
  uVar2 = 0;
  libaom_test::I420VideoSource::I420VideoSource
            ((I420VideoSource *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,
             (uint)((ulong)in_stack_fffffffffffffe40 >> 0x20),(uint)in_stack_fffffffffffffe40,
             (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),(int)in_stack_fffffffffffffe38,
             (uint)in_RDI,(int)paVar6);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  (in_RDI->super_EncoderTest).init_flags_ = 0x10000;
  (in_RDI->super_EncoderTest).cfg_.g_w = 0x160;
  (in_RDI->super_EncoderTest).cfg_.g_h = 0x120;
  in_RDI->change_bitrate_ = true;
  in_RDI->frame_change_bitrate_ = 0x78;
  in_RDI->set_scale_mode_ = false;
  in_RDI->set_scale_mode2_ = false;
  in_RDI->set_scale_mode3_ = false;
  in_RDI->mismatch_psnr_ = 0.0;
  in_RDI->mismatch_nframes_ = 0;
  in_RDI->is_screen_ = true;
  ResizeRealtimeTest::DefaultConfig(in_RDI);
  (in_RDI->super_EncoderTest).cfg_.rc_dropframe_thresh = 0;
  (in_RDI->super_EncoderTest).cfg_.rc_target_bitrate = 100;
  (in_RDI->super_EncoderTest).cfg_.rc_resize_mode = 3;
  (in_RDI->super_EncoderTest).cfg_.g_forced_max_frame_width = 0x500;
  (in_RDI->super_EncoderTest).cfg_.g_forced_max_frame_height = 0x500;
  bVar1 = testing::internal::AlwaysTrue();
  TVar5 = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper(in_stack_fffffffffffffe50)
    ;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(in_RDI->super_EncoderTest)._vptr_EncoderTest[2])(&in_RDI->super_EncoderTest,local_68);
    }
    bVar1 = testing::internal::HasNewFatalFailureHelper::has_new_fatal_failure(&local_b8);
    if (bVar1) {
      local_bc = 2;
    }
    else {
      local_bc = 0;
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              ((HasNewFatalFailureHelper *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
    TVar5 = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
    if (local_bc == 0) {
      local_d4 = (in_RDI->super_EncoderTest).cfg_.g_w;
      local_d8 = (in_RDI->super_EncoderTest).cfg_.g_h;
      local_dc = 0;
      local_e0 = 0;
      local_e8 = &in_RDI->frame_info_list_;
      local_f0._M_current =
           (FrameInfo *)
           std::
           vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
           ::begin((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                    *)CONCAT44(in_stack_fffffffffffffe1c,uVar2));
      local_f8 = (FrameInfo *)
                 std::
                 vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                 ::end((vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>
                        *)CONCAT44(in_stack_fffffffffffffe1c,uVar2));
      while( true ) {
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe24,uVar3),
                           (__normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                            *)CONCAT44(in_stack_fffffffffffffe1c,uVar2));
        TVar5 = (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20);
        if (!bVar1) break;
        local_100 = __gnu_cxx::
                    __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
                    ::operator*(&local_f0);
        if ((local_100->w != local_d4) || (local_100->h != local_d8)) {
          if (local_dc < in_RDI->frame_change_bitrate_) {
            testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                      (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                       ,(uint *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_110);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe50);
              in_stack_fffffffffffffe50 =
                   (HasNewFatalFailureHelper *)
                   testing::AssertionResult::failure_message((AssertionResult *)0x8e3e8f);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe50,
                         (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                         (char *)in_stack_fffffffffffffe40,
                         (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
              testing::Message::~Message((Message *)0x8e3eec);
            }
            local_bc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e3f70);
            if (local_bc != 0) goto LAB_008e43fe;
            testing::internal::CmpHelperLT<unsigned_int,unsigned_int>
                      (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28
                       ,(uint *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(local_130);
            if (!bVar1) {
              testing::Message::Message((Message *)in_stack_fffffffffffffe50);
              in_stack_fffffffffffffe48 =
                   (string *)testing::AssertionResult::failure_message((AssertionResult *)0x8e3ff8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)in_stack_fffffffffffffe50,
                         (Type)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                         (char *)in_stack_fffffffffffffe40,
                         (int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30);
              testing::internal::AssertHelper::operator=
                        (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
              testing::Message::~Message((Message *)0x8e4055);
            }
            local_bc = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e40d9);
            if (local_bc != 0) goto LAB_008e43fe;
            local_e0 = local_e0 + 1;
          }
          local_d4 = local_100->w;
          local_d8 = local_100->h;
        }
        local_dc = local_dc + 1;
        __gnu_cxx::
        __normal_iterator<(anonymous_namespace)::FrameInfo_*,_std::vector<(anonymous_namespace)::FrameInfo,_std::allocator<(anonymous_namespace)::FrameInfo>_>_>
        ::operator++(&local_f0);
      }
      testing::internal::CmpHelperGE<int,int>
                (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,
                 (int *)in_stack_fffffffffffffe28,(int *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(local_150);
      if (!bVar1) {
        testing::Message::Message((Message *)in_stack_fffffffffffffe50);
        in_stack_fffffffffffffe40 =
             testing::Message::operator<<
                       ((Message *)CONCAT44(in_stack_fffffffffffffe24,uVar3),
                        (char (*) [42])CONCAT44(in_stack_fffffffffffffe1c,uVar2));
        in_stack_fffffffffffffe38 =
             testing::AssertionResult::failure_message((AssertionResult *)0x8e41dd);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)in_stack_fffffffffffffe50,TVar5,(char *)in_stack_fffffffffffffe40
                   ,(int)((ulong)in_stack_fffffffffffffe38 >> 0x20),in_stack_fffffffffffffe30);
        testing::internal::AssertHelper::operator=
                  (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
        testing::internal::AssertHelper::~AssertHelper
                  ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
        testing::Message::~Message((Message *)0x8e4237);
      }
      local_bc = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e42bb);
      if (local_bc == 0) {
        ResizeRealtimeTest::GetMismatchFrames(in_RDI);
        testing::internal::EqHelper::Compare<unsigned_int,_unsigned_int,_nullptr>
                  (in_stack_fffffffffffffe38,in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,
                   (uint *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
        iVar4 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_178);
        if (!bVar1) {
          testing::Message::Message((Message *)in_stack_fffffffffffffe50);
          message = testing::AssertionResult::failure_message((AssertionResult *)0x8e4343);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)in_stack_fffffffffffffe50,TVar5,
                     (char *)in_stack_fffffffffffffe40,iVar4,message);
          testing::internal::AssertHelper::operator=
                    (in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
          testing::internal::AssertHelper::~AssertHelper
                    ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
          testing::Message::~Message((Message *)0x8e4391);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x8e43f3);
        local_bc = 0;
      }
      goto LAB_008e43fe;
    }
    if (local_bc != 2) goto LAB_008e43fe;
  }
  iVar4 = (int)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  testing::Message::Message((Message *)in_stack_fffffffffffffe50);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffffe50,TVar5,(char *)in_stack_fffffffffffffe40,iVar4
             ,in_stack_fffffffffffffe30);
  testing::internal::AssertHelper::operator=(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98);
  testing::internal::AssertHelper::~AssertHelper
            ((AssertHelper *)CONCAT44(in_stack_fffffffffffffe24,uVar3));
  testing::Message::~Message((Message *)0x8e3cf3);
  local_bc = 1;
LAB_008e43fe:
  libaom_test::I420VideoSource::~I420VideoSource((I420VideoSource *)0x8e440b);
  return;
}

Assistant:

TEST_P(ResizeRealtimeTest, TestInternalResizeDownUpChangeBitRateScreen) {
  ::libaom_test::I420VideoSource video("hantro_collage_w352h288.yuv", 352, 288,
                                       30, 1, 0, 300);
  init_flags_ = AOM_CODEC_USE_PSNR;
  cfg_.g_w = 352;
  cfg_.g_h = 288;
  change_bitrate_ = true;
  frame_change_bitrate_ = 120;
  set_scale_mode_ = false;
  set_scale_mode2_ = false;
  set_scale_mode3_ = false;
  mismatch_psnr_ = 0.0;
  mismatch_nframes_ = 0;
  is_screen_ = true;
  DefaultConfig();
  // Disable dropped frames.
  cfg_.rc_dropframe_thresh = 0;
  // Starting bitrate low.
  cfg_.rc_target_bitrate = 100;
  cfg_.rc_resize_mode = RESIZE_DYNAMIC;
  cfg_.g_forced_max_frame_width = 1280;
  cfg_.g_forced_max_frame_height = 1280;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));

#if CONFIG_AV1_DECODER
  unsigned int last_w = cfg_.g_w;
  unsigned int last_h = cfg_.g_h;
  unsigned int frame_number = 0;
  int resize_down_count = 0;
  for (const auto &info : frame_info_list_) {
    if (info.w != last_w || info.h != last_h) {
      if (frame_number < frame_change_bitrate_) {
        // Verify that resize down occurs, before bitrate is increased.
        ASSERT_LT(info.w, last_w);
        ASSERT_LT(info.h, last_h);
        resize_down_count++;
      }
      last_w = info.w;
      last_h = info.h;
    }
    frame_number++;
  }

  // Verify that we get at least 1 resize event in this test.
  ASSERT_GE(resize_down_count, 1)
      << "Resizing down should occur at lease once.";
  EXPECT_EQ(static_cast<unsigned int>(0), GetMismatchFrames());
#else
  printf("Warning: AV1 decoder unavailable, unable to check resize count!\n");
#endif
}